

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getTotalEnergy(Thermo *this)

{
  SnapshotManager *this_00;
  Snapshot *this_01;
  undefined8 *in_RDI;
  Thermo *this_02;
  RealType RVar1;
  Thermo *unaff_retaddr;
  Snapshot *snap;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  this_01 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((this_01->hasTotalEnergy & 1U) == 0) {
    this_02 = (Thermo *)getKinetic(unaff_retaddr);
    RVar1 = getPotential(this_02);
    Snapshot::setTotalEnergy(this_01,(double)this_02 + RVar1);
  }
  RVar1 = Snapshot::getTotalEnergy(this_01);
  return RVar1;
}

Assistant:

RealType Thermo::getTotalEnergy() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTotalEnergy) {
      snap->setTotalEnergy(this->getKinetic() + this->getPotential());
    }

    return snap->getTotalEnergy();
  }